

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cpp
# Opt level: O2

void __thiscall
Table_TableCannotBeMultiline_Test::~Table_TableCannotBeMultiline_Test
          (Table_TableCannotBeMultiline_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Table, TableCannotBeMultiline) {
    std::istringstream input("[\ntable.123.\"table\\ntable\"]");
    events_aggregator_t handler;

    try {
        loltoml::parse(input, handler);
        FAIL();
    } catch (const loltoml::parser_error_t &e) {
        EXPECT_EQ(1, e.offset());
    }
}